

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_22(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long lVar2;
  QPDFPageObjectHelper QVar3;
  QPDFPageObjectHelper QVar4;
  undefined8 uVar5;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDFPageDocumentHelper dh;
  undefined8 in_stack_ffffffffffffff38;
  long in_stack_ffffffffffffff40;
  long lVar6;
  long in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff68;
  undefined **local_70 [2];
  long local_60;
  undefined8 local_58;
  long local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  QPDFPageDocumentHelper local_38;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_38,pdf);
  QPDFPageDocumentHelper::getAllPages();
  if (in_stack_ffffffffffffff48 != in_stack_ffffffffffffff40) {
    local_70[1] = *(undefined ***)(in_stack_ffffffffffffff40 + 8);
    local_60 = *(long *)(in_stack_ffffffffffffff40 + 0x10);
    if (local_60 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_60 + 8) = *(int *)(local_60 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_60 + 8) = *(int *)(local_60 + 8) + 1;
      }
    }
    local_58 = *(undefined8 *)(in_stack_ffffffffffffff40 + 0x18);
    local_50 = *(long *)(in_stack_ffffffffffffff40 + 0x20);
    if (local_50 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_50 + 8) = *(int *)(local_50 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_50 + 8) = *(int *)(local_50 + 8) + 1;
      }
    }
    local_70[0] = &PTR__QPDFPageObjectHelper_001589e8;
    local_48 = *(element_type **)(in_stack_ffffffffffffff40 + 0x28);
    local_40._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_stack_ffffffffffffff40 + 0x30);
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      }
    }
    QVar3._8_8_ = in_stack_ffffffffffffff40;
    QVar3._0_8_ = in_stack_ffffffffffffff38;
    QVar3._16_8_ = in_stack_ffffffffffffff48;
    QVar3._24_8_ = in_stack_ffffffffffffff50;
    QVar3._32_1_ = SUB81(in_stack_ffffffffffffff58,0);
    QVar3._33_7_ = SUB87(in_stack_ffffffffffffff58,1);
    QVar3.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)in_stack_ffffffffffffff60;
    QVar3.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = in_stack_ffffffffffffff68._M_pi;
    lVar6 = in_stack_ffffffffffffff40;
    QPDFPageDocumentHelper::removePage(QVar3);
    QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_70);
    uVar5 = *(undefined8 *)(in_stack_ffffffffffffff40 + 8);
    _Var1._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   (in_stack_ffffffffffffff40 + 0x10);
    if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      }
    }
    lVar2 = *(long *)(in_stack_ffffffffffffff40 + 0x20);
    if (lVar2 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      }
    }
    lVar2 = *(long *)(in_stack_ffffffffffffff40 + 0x30);
    if (lVar2 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      }
    }
    QVar4._8_8_ = lVar6;
    QVar4._0_8_ = in_stack_ffffffffffffff38;
    QVar4._16_8_ = in_stack_ffffffffffffff48;
    QVar4._24_8_ = in_stack_ffffffffffffff50;
    QVar4._32_8_ = &PTR__QPDFPageObjectHelper_001589e8;
    QVar4.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar5;
    QVar4.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var1._M_pi;
    QPDFPageDocumentHelper::removePage(QVar4);
    QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&stack0xffffffffffffff58);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"you can\'t see this",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
               &stack0xffffffffffffff40);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_38);
    return;
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&stack0xffffffffffffff58);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
             &stack0xffffffffffffff40);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_38);
  _Unwind_Resume(uVar5);
}

Assistant:

static void
test_22(QPDF& pdf, char const* arg2)
{
    // Try to remove a page we don't have
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> pages = dh.getAllPages();
    QPDFPageObjectHelper& page = pages.at(0);
    dh.removePage(page);
    dh.removePage(page);
    std::cout << "you can't see this" << std::endl;
}